

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTSoundBank_Prepare
                   (FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,int32_t timeOffset
                   ,FACTCue **ppCue)

{
  uint32_t *puVar1;
  ushort uVar2;
  FACTCueData *pFVar3;
  FACTAudioEngine *pFVar4;
  FACTCue *pFVar5;
  uint32_t uVar6;
  FACTCue *pFVar7;
  float *pfVar8;
  FACTCue *pFVar9;
  long lVar10;
  long lVar11;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *ppCue = (FACTCue *)0x0;
    uVar6 = 1;
  }
  else {
    pFVar7 = (FACTCue *)(*pSoundBank->parentEngine->pMalloc)(0xb0);
    *ppCue = pFVar7;
    SDL_memset(pFVar7,0,0xb0);
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    (*ppCue)->parentBank = pSoundBank;
    (*ppCue)->next = (FACTCue *)0x0;
    pFVar7 = *ppCue;
    pFVar7->managed = '\0';
    pFVar7->index = nCueIndex;
    pFVar7->notifyOnDestroy = '\0';
    pFVar7->usercontext = (void *)0x0;
    (*ppCue)->data = pSoundBank->cues + nCueIndex;
    pFVar7 = *ppCue;
    pFVar3 = pFVar7->data;
    if ((pFVar3->flags & 4) == 0) {
      lVar10 = 0x10;
      lVar11 = 0;
      do {
        if ((ulong)pSoundBank->variationCount * 0x10 + lVar10 == 0x10) goto LAB_0010b895;
        lVar10 = lVar10 + -0x10;
        puVar1 = (uint32_t *)((long)pSoundBank->variationCodes + lVar11);
        lVar11 = lVar11 + 4;
      } while (pFVar3->sbCode != *puVar1);
      (pFVar7->field_7).variation = (FACTVariationTable *)((long)pSoundBank->variations - lVar10);
      pFVar7 = *ppCue;
LAB_0010b895:
      if (((pFVar7->field_7).variation)->flags == '\x03') {
        pFVar7->interactive =
             pSoundBank->parentEngine->variables[((pFVar7->field_7).variation)->variable].
             initialValue;
      }
    }
    else {
      lVar10 = 0x28;
      lVar11 = 0;
      do {
        if ((ulong)pSoundBank->soundCount * 0x28 + lVar10 == 0x28) goto LAB_0010b902;
        lVar10 = lVar10 + -0x28;
        puVar1 = (uint32_t *)((long)pSoundBank->soundCodes + lVar11);
        lVar11 = lVar11 + 4;
      } while (pFVar3->sbCode != *puVar1);
      (pFVar7->field_7).variation = (FACTVariationTable *)((long)pSoundBank->sounds - lVar10);
    }
LAB_0010b902:
    pfVar8 = (float *)(*pSoundBank->parentEngine->pMalloc)
                                ((ulong)pSoundBank->parentEngine->variableCount << 2);
    (*ppCue)->variableValues = pfVar8;
    pFVar4 = pSoundBank->parentEngine;
    uVar2 = pFVar4->variableCount;
    for (lVar10 = 0; (ulong)uVar2 * 4 != lVar10; lVar10 = lVar10 + 4) {
      *(float *)((long)(*ppCue)->variableValues + lVar10) =
           (&pFVar4->variables->initialValue)[lVar10];
    }
    pFVar7 = *ppCue;
    pFVar7->state = 4;
    pFVar5 = pSoundBank->cueList;
    while (pFVar9 = pFVar5, pFVar9 != (FACTCue *)0x0) {
      pSoundBank = (FACTSoundBank *)pFVar9;
      pFVar5 = pFVar9->next;
    }
    pSoundBank->cueList = pFVar7;
    FAudio_PlatformUnlockMutex(pFVar4->apiLock);
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

uint32_t FACTSoundBank_Prepare(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue
) {
	uint16_t i;
	FACTCue *latest;

	if (pSoundBank == NULL)
	{
		*ppCue = NULL;
		return 1;
	}

	*ppCue = (FACTCue*) pSoundBank->parentEngine->pMalloc(sizeof(FACTCue));
	FAudio_zero(*ppCue, sizeof(FACTCue));

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	/* Engine references */
	(*ppCue)->parentBank = pSoundBank;
	(*ppCue)->next = NULL;
	(*ppCue)->managed = 0;
	(*ppCue)->index = nCueIndex;
	(*ppCue)->notifyOnDestroy = 0;
	(*ppCue)->usercontext = NULL;

	/* Sound data */
	(*ppCue)->data = &pSoundBank->cues[nCueIndex];
	if ((*ppCue)->data->flags & 0x04)
	{
		for (i = 0; i < pSoundBank->soundCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->soundCodes[i])
			{
				(*ppCue)->sound = &pSoundBank->sounds[i];
				break;
			}
		}
	}
	else
	{
		for (i = 0; i < pSoundBank->variationCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->variationCodes[i])
			{
				(*ppCue)->variation = &pSoundBank->variations[i];
				break;
			}
		}
		if ((*ppCue)->variation->flags == 3)
		{
			(*ppCue)->interactive = pSoundBank->parentEngine->variables[
				(*ppCue)->variation->variable
			].initialValue;
		}
	}

	/* Instance data */
	(*ppCue)->variableValues = (float*) pSoundBank->parentEngine->pMalloc(
		sizeof(float) * pSoundBank->parentEngine->variableCount
	);
	for (i = 0; i < pSoundBank->parentEngine->variableCount; i += 1)
	{
		(*ppCue)->variableValues[i] =
			pSoundBank->parentEngine->variables[i].initialValue;
	}

	/* Playback */
	(*ppCue)->state = FACT_STATE_PREPARED;

	/* Add to the SoundBank Cue list */
	if (pSoundBank->cueList == NULL)
	{
		pSoundBank->cueList = *ppCue;
	}
	else
	{
		latest = pSoundBank->cueList;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = *ppCue;
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}